

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmakemain.cxx
# Opt level: O3

int main(int ac,char **av)

{
  char **__args;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer *pppcVar2;
  char cVar3;
  char cVar4;
  char *pcVar5;
  size_type sVar6;
  bool bVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  char **__args_00;
  uv_loop_t *loop;
  size_t sVar13;
  ostream *poVar14;
  char *pcVar15;
  undefined4 uVar16;
  string *psVar17;
  cmake *this;
  ulong uVar18;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool local_4e1;
  int local_4cc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string dir;
  bool local_488;
  unsigned_long numJobs;
  undefined8 local_478;
  undefined1 local_470 [16];
  string config;
  allocator_type local_43a;
  allocator<char> local_439;
  ulong local_438;
  undefined4 local_42c;
  string dir_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  targets;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  nativeOptions;
  CommandLineArguments args;
  cmake cm;
  
  cmsys::Encoding::CommandLineArguments::Main(&args,ac,av);
  uVar8 = cmsys::Encoding::CommandLineArguments::argc(&args);
  __args_00 = cmsys::Encoding::CommandLineArguments::argv(&args);
  cmsys::SystemTools::EnableMSVCDebugHook();
  cmSystemTools::InitializeLibUV();
  cmSystemTools::FindCMakeResources(*__args_00);
  if ((int)uVar8 < 2) {
LAB_00142a30:
    uVar8 = do_cmake(uVar8,__args_00);
    cmDynamicLoader::FlushCache();
    loop = uv_default_loop();
    uv_loop_close(loop);
    goto LAB_00143c02;
  }
  pcVar5 = __args_00[1];
  iVar9 = strcmp(pcVar5,"--build");
  if (iVar9 == 0) {
    targets.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    targets.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    targets.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    config._M_dataplus._M_p = (pointer)&config.field_2;
    config.field_2._M_allocated_capacity._0_4_ = 0x75626544;
    config.field_2._M_allocated_capacity._4_2_ = 0x67;
    config._M_string_length = 5;
    dir._M_dataplus._M_p = (pointer)&dir.field_2;
    dir._M_string_length = 0;
    dir.field_2._M_allocated_capacity = dir.field_2._M_allocated_capacity & 0xffffffffffffff00;
    nativeOptions.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    nativeOptions.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    nativeOptions.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_4e1 = cmsys::SystemTools::HasEnv("VERBOSE");
    dir_1._M_dataplus._M_p._0_4_ = 2;
    if (uVar8 == 2) {
      uVar16 = 0;
LAB_0014307e:
      pppcVar2 = &cm.Generators.
                  super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
      cm.Generators.
      super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      cm.Generators.
      super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)((ulong)cm.Generators.
                            super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffffffffff00)
      ;
      cm.Generators.
      super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)pppcVar2;
      bVar7 = cmsys::SystemTools::GetEnv("CMAKE_BUILD_PARALLEL_LEVEL",(string *)&cm);
      local_4cc = -1;
      if (bVar7) {
        if (cm.Generators.
            super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
            ._M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) {
          local_4cc = 0;
        }
        else {
          numJobs = 0;
          bVar7 = cmSystemTools::StringToULong
                            ((char *)cm.Generators.
                                     super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start,&numJobs);
          if (bVar7) {
            local_4cc = (int)numJobs;
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"\'CMAKE_BUILD_PARALLEL_LEVEL\' environment variable\n"
                       ,0x32);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"invalid number \'",0x10);
            poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cerr,
                                 (char *)cm.Generators.
                                         super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
                                         ._M_impl.super__Vector_impl_data._M_start,
                                 (long)cm.Generators.
                                       super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
                                       ._M_impl.super__Vector_impl_data._M_finish);
            std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\' given.\n\n",10);
            dir._M_string_length = 0;
            *dir._M_dataplus._M_p = '\0';
            local_4cc = -1;
          }
        }
      }
      if (cm.Generators.
          super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)pppcVar2) {
        operator_delete(cm.Generators.
                        super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)cm.Generators.
                              super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
      }
    }
    else {
      iVar12 = 2;
      iVar9 = 1;
      local_4cc = -1;
      local_438 = 0;
      bVar7 = false;
      local_42c = 0;
      do {
        __args = __args_00 + iVar12;
        if (iVar9 == 4) {
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const*const&>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &nativeOptions,__args);
          iVar10 = 4;
          goto LAB_00142e25;
        }
        pcVar5 = *__args;
        cVar3 = *pcVar5;
        if ((cVar3 == '-') && (pcVar5[1] == 'j')) {
          if (iVar12 + 1 < (int)uVar8) {
            pcVar15 = __args_00[iVar12 + 1];
          }
          else {
            pcVar15 = (char *)0x0;
          }
          local_4cc = anon_unknown.dwarf_d604::extract_job_number((int *)&dir_1,pcVar5,pcVar15,2);
LAB_00142ce1:
          iVar10 = 0;
          if (local_4cc < 0) {
            dir._M_string_length = 0;
            *dir._M_dataplus._M_p = '\0';
          }
        }
        else {
          iVar10 = strncmp(pcVar5,"--parallel",10);
          if (iVar10 == 0) {
            if (iVar12 + 1 < (int)uVar8) {
              pcVar15 = __args_00[iVar12 + 1];
            }
            else {
              pcVar15 = (char *)0x0;
            }
            local_4cc = anon_unknown.dwarf_d604::extract_job_number((int *)&dir_1,pcVar5,pcVar15,10)
            ;
            goto LAB_00142ce1;
          }
          iVar11 = strcmp(pcVar5,"--target");
          iVar10 = 2;
          if ((iVar11 != 0) && (((cVar3 != '-' || (pcVar5[1] != 't')) || (pcVar5[2] != '\0')))) {
            iVar10 = strcmp(pcVar5,"--config");
            if (iVar10 == 0) {
              iVar10 = 3;
            }
            else {
              iVar10 = strcmp(pcVar5,"--clean-first");
              if (iVar10 == 0) {
                local_42c = 1;
                iVar10 = 0;
              }
              else {
                iVar10 = strcmp(pcVar5,"--verbose");
                if (iVar10 == 0) {
LAB_00142d1f:
                  local_4e1 = true;
                  iVar10 = 0;
                }
                else {
                  iVar10 = iVar9;
                  if (cVar3 == '-') {
                    cVar4 = pcVar5[1];
                    if (cVar4 == 'v') {
                      if (pcVar5[2] == '\0') goto LAB_00142d1f;
                      goto LAB_00142d29;
                    }
                    iVar11 = strcmp(pcVar5,"--use-stderr");
                    if (iVar11 == 0) goto LAB_00142e25;
                    if ((cVar4 == '-') && (pcVar5[2] == '\0')) {
                      iVar10 = 4;
                      goto LAB_00142e25;
                    }
                  }
                  else {
LAB_00142d29:
                    iVar11 = strcmp(pcVar5,"--use-stderr");
                    if (iVar11 == 0) goto LAB_00142e25;
                  }
                  sVar6 = config._M_string_length;
                  if (iVar9 == 3) {
                    strlen(pcVar5);
                    std::__cxx11::string::_M_replace((ulong)&config,0,(char *)sVar6,(ulong)pcVar5);
                    iVar10 = 0;
                  }
                  else if (iVar9 == 2) {
                    if (cVar3 == '\0') {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cerr,"Warning: Argument number ",0x19);
                      poVar14 = (ostream *)std::ostream::operator<<(&std::cerr,iVar12);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar14," after --target option is empty.",0x20);
                      std::endl<char,std::char_traits<char>>(poVar14);
                      uVar18 = local_438;
                      if (!bVar7) goto LAB_00142fcb;
LAB_00142f78:
                      if ((uVar18 & 1) == 0) {
                        bVar7 = true;
                        local_438 = 0;
                      }
                      else {
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cerr,
                                   "Error: Building \'clean\' and other targets together is not supported."
                                   ,0x44);
                        std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
                        dir._M_string_length = 0;
                        *dir._M_dataplus._M_p = '\0';
                        bVar7 = true;
                        local_438 = CONCAT71((int7)((ulong)dir._M_dataplus._M_p >> 8),1);
                      }
                    }
                    else {
                      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                      emplace_back<char_const*const&>
                                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                  *)&targets,__args);
                      iVar9 = strcmp(*__args,"clean");
                      uVar18 = CONCAT71((int7)(local_438 >> 8),(byte)local_438 | iVar9 != 0);
                      if (iVar9 == 0 || bVar7) goto LAB_00142f78;
LAB_00142fcb:
                      local_438 = uVar18;
                      bVar7 = false;
                    }
                    iVar10 = 2;
                  }
                  else if (iVar9 == 1) {
                    numJobs = (unsigned_long)local_470;
                    sVar13 = strlen(pcVar5);
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&numJobs,pcVar5,pcVar5 + sVar13);
                    cmsys::SystemTools::CollapseFullPath((string *)&cm,(string *)&numJobs);
                    std::__cxx11::string::operator=((string *)&dir,(string *)&cm);
                    if (cm.Generators.
                        super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
                        ._M_impl.super__Vector_impl_data._M_start !=
                        (pointer)&cm.Generators.
                                  super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                      operator_delete(cm.Generators.
                                      super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start,
                                      (long)cm.Generators.
                                            super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
                    }
                    iVar10 = 0;
                    if ((undefined1 *)numJobs != local_470) {
                      operator_delete((void *)numJobs,(ulong)(local_470._0_8_ + 1));
                    }
                  }
                  else {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cerr,"Unknown argument ",0x11);
                    pcVar5 = *__args;
                    if (pcVar5 == (char *)0x0) {
                      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x60f338);
                    }
                    else {
                      sVar13 = strlen(pcVar5);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cerr,pcVar5,sVar13);
                    }
                    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '8');
                    std::ostream::put('8');
                    std::ostream::flush();
                    dir._M_string_length = 0;
                    *dir._M_dataplus._M_p = '\0';
                  }
                }
              }
            }
          }
        }
LAB_00142e25:
        iVar9 = iVar10;
        iVar12 = (int)dir_1._M_dataplus._M_p + 1;
        dir_1._M_dataplus._M_p._0_4_ = iVar12;
      } while (iVar12 < (int)uVar8);
      uVar16 = local_42c;
      if (local_4cc == -1) goto LAB_0014307e;
    }
    if (dir._M_string_length == 0) {
      uVar8 = 1;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "Usage: cmake --build <dir> [options] [-- [native-options]]\nOptions:\n  <dir>          = Project binary directory to be built.\n  --parallel [<jobs>], -j [<jobs>]\n                 = Build in parallel using the given number of jobs. \n                   If <jobs> is omitted the native build tool\'s \n                   default number is used.\n                   The CMAKE_BUILD_PARALLEL_LEVEL environment variable\n                   specifies a default parallel level when this option\n                   is not given.\n  --target <tgt>..., -t <tgt>... \n                 = Build <tgt> instead of default targets.\n  --config <cfg> = For multi-configuration tools, choose <cfg>.\n  --clean-first  = Build target \'clean\' first, then build.\n                   (To clean only, use --target \'clean\'.)\n --verbose, -v   = Enable verbose output - if supported - including\n                   the build commands to be executed. \n  --             = Pass remaining options to the native tool.\n"
                 ,0x3cc);
    }
    else {
      cmake::cmake(&cm,RoleInternal,Project);
      local_478 = 0;
      local_470._8_8_ =
           std::
           _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmakemain.cxx:531:5)>
           ::_M_invoke;
      local_470._0_8_ =
           std::
           _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmakemain.cxx:531:5)>
           ::_M_manager;
      numJobs = (unsigned_long)&cm;
      cmSystemTools::SetMessageCallback((MessageCallback *)&numJobs);
      if ((code *)local_470._0_8_ != (code *)0x0) {
        (*(code *)local_470._0_8_)(&numJobs,&numJobs,3);
      }
      dir_1._M_string_length = 0;
      dir_1.field_2._8_8_ =
           std::
           _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_float),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmakemain.cxx:534:26)>
           ::_M_invoke;
      dir_1.field_2._M_allocated_capacity =
           (size_type)
           std::
           _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_float),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmakemain.cxx:534:26)>
           ::_M_manager;
      dir_1._M_dataplus._M_p = (pointer)&cm;
      cmake::SetProgressCallback(&cm,(ProgressCallbackType *)&dir_1);
      if (dir_1.field_2._M_allocated_capacity != 0) {
        (*(code *)dir_1.field_2._M_allocated_capacity)(&dir_1,&dir_1,3);
      }
      uVar8 = cmake::Build(&cm,local_4cc,&dir,&targets,&config,&nativeOptions,
                           (bool)((byte)uVar16 & 1),local_4e1);
      cmake::~cmake(&cm);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&nativeOptions);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)dir._M_dataplus._M_p != &dir.field_2) {
      operator_delete(dir._M_dataplus._M_p,dir.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)config._M_dataplus._M_p != &config.field_2) {
      operator_delete(config._M_dataplus._M_p,
                      CONCAT26(config.field_2._M_allocated_capacity._6_2_,
                               CONCAT24(config.field_2._M_allocated_capacity._4_2_,
                                        config.field_2._M_allocated_capacity._0_4_)) + 1);
    }
    this = (cmake *)&targets;
LAB_00143bfd:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)this);
  }
  else {
    iVar9 = strcmp(pcVar5,"--install");
    if (iVar9 == 0) {
      config._M_dataplus._M_p = (pointer)&config.field_2;
      config._M_string_length = 0;
      config.field_2._M_allocated_capacity._0_4_ =
           config.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
      dir._M_dataplus._M_p = (pointer)&dir.field_2;
      dir._M_string_length = 0;
      dir.field_2._M_allocated_capacity = dir.field_2._M_allocated_capacity & 0xffffffffffffff00;
      numJobs = (unsigned_long)local_470;
      local_478 = 0;
      local_470._0_8_ = local_470._0_8_ & 0xffffffffffffff00;
      dir_1._M_dataplus._M_p = (pointer)&dir_1.field_2;
      dir_1._M_string_length = 0;
      dir_1.field_2._M_allocated_capacity = dir_1.field_2._M_allocated_capacity & 0xffffffffffffff00
      ;
      local_488 = cmsys::SystemTools::HasEnv("VERBOSE");
      if (uVar8 == 2) {
        bVar7 = false;
      }
      else {
        iVar9 = 1;
        uVar18 = 2;
        bVar7 = false;
        do {
          pcVar5 = __args_00[uVar18];
          iVar12 = strcmp(pcVar5,"--config");
          if (iVar12 == 0) {
            iVar9 = 2;
          }
          else {
            iVar12 = strcmp(pcVar5,"--component");
            if (iVar12 == 0) {
              iVar9 = 3;
            }
            else {
              iVar12 = strcmp(pcVar5,"--prefix");
              if (iVar12 == 0) {
                iVar9 = 4;
              }
              else {
                iVar12 = strcmp(pcVar5,"--strip");
                iVar10 = 0;
                if (iVar12 == 0) {
                  bVar7 = true;
                  iVar9 = iVar10;
                }
                else {
                  iVar12 = strcmp(pcVar5,"--verbose");
                  if ((iVar12 == 0) ||
                     (((*pcVar5 == '-' && (pcVar5[1] == 'v')) && (pcVar5[2] == '\0')))) {
                    local_488 = true;
                    iVar9 = 0;
                  }
                  else if (iVar9 - 1U < 4) {
                    psVar17 = &config;
                    switch(iVar9) {
                    case 1:
                      targets.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start =
                           (pointer)&targets.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
                      sVar13 = strlen(pcVar5);
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&targets,pcVar5,pcVar5 + sVar13);
                      cmsys::SystemTools::CollapseFullPath((string *)&cm,(string *)&targets);
                      std::__cxx11::string::operator=((string *)&dir_1,(string *)&cm);
                      if (cm.Generators.
                          super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
                          ._M_impl.super__Vector_impl_data._M_start !=
                          (pointer)&cm.Generators.
                                    super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                        operator_delete(cm.Generators.
                                        super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
                                        ._M_impl.super__Vector_impl_data._M_start,
                                        (long)cm.Generators.
                                              super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage + 1
                                       );
                      }
                      iVar9 = iVar10;
                      if (targets.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start !=
                          (pointer)&targets.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                        operator_delete(targets.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start,
                                        (ulong)((long)&((targets.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  )->_M_dataplus)._M_p + 1));
                      }
                      goto LAB_001435c7;
                    case 3:
                      psVar17 = &dir;
                      break;
                    case 4:
                      psVar17 = (string *)&numJobs;
                    }
                    pcVar15 = (char *)psVar17->_M_string_length;
                    strlen(pcVar5);
                    std::__cxx11::string::_M_replace((ulong)psVar17,0,pcVar15,(ulong)pcVar5);
                    iVar9 = 0;
                  }
                  else {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cerr,"Unknown argument ",0x11);
                    pcVar5 = __args_00[uVar18];
                    if (pcVar5 == (char *)0x0) {
                      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x60f338);
                    }
                    else {
                      sVar13 = strlen(pcVar5);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cerr,pcVar5,sVar13);
                    }
                    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '8');
                    std::ostream::put('8');
                    std::ostream::flush();
                    dir_1._M_string_length = 0;
                    *dir_1._M_dataplus._M_p = '\0';
                  }
                }
              }
            }
          }
LAB_001435c7:
          uVar18 = uVar18 + 1;
        } while (uVar8 != uVar18);
      }
      if (dir_1._M_string_length == 0) {
        uVar8 = 1;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,
                   "Usage: cmake --install <dir> [options]\nOptions:\n  <dir>              = Project binary directory to install.\n  --config <cfg>     = For multi-configuration tools, choose <cfg>.\n  --component <comp> = Component-based install. Only install <comp>.\n  --prefix <prefix>  = The installation prefix CMAKE_INSTALL_PREFIX.\n  --strip            = Performing install/strip.\n  -v --verbose       = Enable verbose output.\n"
                   ,0x199);
      }
      else {
        cmake::cmake(&cm,RoleScript,Script);
        targets.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        targets.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)std::
                      _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmakemain.cxx:617:5)>
                      ::_M_manager;
        targets.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)&cm;
        cmSystemTools::SetMessageCallback((MessageCallback *)&targets);
        if (targets.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
          (*(code *)targets.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage)(&targets,&targets,3);
        }
        nativeOptions.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        nativeOptions.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)std::
                      _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_float),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmakemain.cxx:620:26)>
                      ::_M_manager;
        nativeOptions.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)&cm;
        cmake::SetProgressCallback(&cm,(ProgressCallbackType *)&nativeOptions);
        if (nativeOptions.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
          (*(code *)nativeOptions.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage)
                    (&nativeOptions,&nativeOptions,3);
        }
        paVar1 = &__str.field_2;
        __str._M_string_length = 0;
        __str.field_2._M_local_buf[0] = '\0';
        __str._M_dataplus._M_p = (pointer)paVar1;
        cmake::SetHomeDirectory(&cm,&__str);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__str._M_dataplus._M_p != paVar1) {
          operator_delete(__str._M_dataplus._M_p,
                          CONCAT71(__str.field_2._M_allocated_capacity._1_7_,
                                   __str.field_2._M_local_buf[0]) + 1);
        }
        __str._M_string_length = 0;
        __str.field_2._M_local_buf[0] = '\0';
        __str._M_dataplus._M_p = (pointer)paVar1;
        cmake::SetHomeOutputDirectory(&cm,&__str);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__str._M_dataplus._M_p != paVar1) {
          operator_delete(__str._M_dataplus._M_p,
                          CONCAT71(__str.field_2._M_allocated_capacity._1_7_,
                                   __str.field_2._M_local_buf[0]) + 1);
        }
        cm.DebugOutput = local_488;
        cm.CurrentWorkingMode = SCRIPT_MODE;
        std::__cxx11::string::string<std::allocator<char>>((string *)&__str,*__args_00,&local_439);
        __l._M_len = 1;
        __l._M_array = &__str;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&args_1,__l,&local_43a);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__str._M_dataplus._M_p != paVar1) {
          operator_delete(__str._M_dataplus._M_p,
                          CONCAT71(__str.field_2._M_allocated_capacity._1_7_,
                                   __str.field_2._M_local_buf[0]) + 1);
        }
        if (local_478 != 0) {
          std::operator+(&__str,"-DCMAKE_INSTALL_PREFIX=",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &numJobs);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&args_1,
                     &__str);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)__str._M_dataplus._M_p != paVar1) {
            operator_delete(__str._M_dataplus._M_p,
                            CONCAT71(__str.field_2._M_allocated_capacity._1_7_,
                                     __str.field_2._M_local_buf[0]) + 1);
          }
        }
        if (dir._M_string_length != 0) {
          std::operator+(&__str,"-DCMAKE_INSTALL_COMPONENT=",&dir);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&args_1,
                     &__str);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)__str._M_dataplus._M_p != paVar1) {
            operator_delete(__str._M_dataplus._M_p,
                            CONCAT71(__str.field_2._M_allocated_capacity._1_7_,
                                     __str.field_2._M_local_buf[0]) + 1);
          }
        }
        if (bVar7) {
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const(&)[27]>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&args_1,
                     (char (*) [27])"-DCMAKE_INSTALL_DO_STRIP=1");
        }
        if (config._M_string_length != 0) {
          std::operator+(&__str,"-DCMAKE_INSTALL_CONFIG_NAME=",&config);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&args_1,
                     &__str);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)__str._M_dataplus._M_p != paVar1) {
            operator_delete(__str._M_dataplus._M_p,
                            CONCAT71(__str.field_2._M_allocated_capacity._1_7_,
                                     __str.field_2._M_local_buf[0]) + 1);
          }
        }
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[3]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&args_1,
                   (char (*) [3])0x4a8211);
        __str._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&__str,dir_1._M_dataplus._M_p,
                   dir_1._M_dataplus._M_p + dir_1._M_string_length);
        std::__cxx11::string::append((char *)&__str);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&args_1,
                   &__str);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__str._M_dataplus._M_p != paVar1) {
          operator_delete(__str._M_dataplus._M_p,
                          CONCAT71(__str.field_2._M_allocated_capacity._1_7_,
                                   __str.field_2._M_local_buf[0]) + 1);
        }
        iVar9 = cmake::Run(&cm,&args_1,false);
        uVar8 = (uint)(iVar9 != 0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&args_1);
        cmake::~cmake(&cm);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)dir_1._M_dataplus._M_p != &dir_1.field_2) {
        operator_delete(dir_1._M_dataplus._M_p,dir_1.field_2._M_allocated_capacity + 1);
      }
      if ((undefined1 *)numJobs != local_470) {
        operator_delete((void *)numJobs,(ulong)(local_470._0_8_ + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)dir._M_dataplus._M_p != &dir.field_2) {
        operator_delete(dir._M_dataplus._M_p,dir.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)config._M_dataplus._M_p == &config.field_2) goto LAB_00143c02;
    }
    else {
      iVar9 = strcmp(pcVar5,"--open");
      if (iVar9 != 0) {
        if (((*pcVar5 != '-') || (pcVar5[1] != 'E')) || (pcVar5[2] != '\0')) goto LAB_00142a30;
        cm.Generators.
        super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        cm.Generators.
        super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        cm.Generators.
        super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&cm,(ulong)(uVar8 - 1));
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const*const&>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&cm,
                   __args_00);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        _M_range_insert<char_const*const*>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&cm,
                   cm.Generators.
                   super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish,__args_00 + 2,__args_00 + uVar8);
        uVar8 = cmcmd::ExecuteCMakeCommand
                          ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&cm);
        this = &cm;
        goto LAB_00143bfd;
      }
      config._M_dataplus._M_p = (pointer)&config.field_2;
      config._M_string_length = 0;
      config.field_2._M_allocated_capacity._0_4_ =
           config.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
      if (uVar8 == 2) {
LAB_00143917:
        uVar8 = 1;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Usage: cmake --open <dir>\n",0x1a);
      }
      else {
        bVar7 = true;
        uVar18 = 2;
        do {
          if (bVar7) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&dir,__args_00[uVar18],(allocator<char> *)&numJobs);
            cmsys::SystemTools::CollapseFullPath((string *)&cm,&dir);
            std::__cxx11::string::operator=((string *)&config,(string *)&cm);
            if (cm.Generators.
                super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
                ._M_impl.super__Vector_impl_data._M_start !=
                (pointer)&cm.Generators.
                          super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              operator_delete(cm.Generators.
                              super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)cm.Generators.
                                    super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)dir._M_dataplus._M_p != &dir.field_2) {
              operator_delete(dir._M_dataplus._M_p,dir.field_2._M_allocated_capacity + 1);
            }
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"Unknown argument ",0x11);
            pcVar5 = __args_00[uVar18];
            if (pcVar5 == (char *)0x0) {
              std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x60f338);
            }
            else {
              sVar13 = strlen(pcVar5);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,pcVar5,sVar13);
            }
            std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '8');
            std::ostream::put('8');
            std::ostream::flush();
            config._M_string_length = 0;
            *config._M_dataplus._M_p = '\0';
          }
          uVar18 = uVar18 + 1;
          bVar7 = false;
        } while (uVar8 != uVar18);
        if (config._M_string_length == 0) goto LAB_00143917;
        cmake::cmake(&cm,RoleInternal,Unknown);
        dir._M_string_length = 0;
        dir.field_2._8_8_ =
             std::
             _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmakemain.cxx:686:5)>
             ::_M_invoke;
        dir.field_2._M_allocated_capacity =
             (size_type)
             std::
             _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmakemain.cxx:686:5)>
             ::_M_manager;
        dir._M_dataplus._M_p = (pointer)&cm;
        cmSystemTools::SetMessageCallback((MessageCallback *)&dir);
        if (dir.field_2._M_allocated_capacity != 0) {
          (*(code *)dir.field_2._M_allocated_capacity)(&dir,&dir,3);
        }
        local_478 = 0;
        local_470._8_8_ =
             std::
             _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_float),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmakemain.cxx:689:26)>
             ::_M_invoke;
        local_470._0_8_ =
             std::
             _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_float),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmakemain.cxx:689:26)>
             ::_M_manager;
        numJobs = (unsigned_long)&cm;
        cmake::SetProgressCallback(&cm,(ProgressCallbackType *)&numJobs);
        if ((code *)local_470._0_8_ != (code *)0x0) {
          (*(code *)local_470._0_8_)(&numJobs,&numJobs,3);
        }
        bVar7 = cmake::Open(&cm,&config,false);
        uVar8 = (uint)!bVar7;
        cmake::~cmake(&cm);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)config._M_dataplus._M_p == &config.field_2) goto LAB_00143c02;
    }
    operator_delete(config._M_dataplus._M_p,
                    CONCAT26(config.field_2._M_allocated_capacity._6_2_,
                             CONCAT24(config.field_2._M_allocated_capacity._4_2_,
                                      config.field_2._M_allocated_capacity._0_4_)) + 1);
  }
LAB_00143c02:
  cmsys::Encoding::CommandLineArguments::~CommandLineArguments(&args);
  return uVar8;
}

Assistant:

int main(int ac, char const* const* av)
{
#if defined(_WIN32) && defined(CMAKE_BUILD_WITH_CMAKE)
  // Replace streambuf so we can output Unicode to console
  cmsys::ConsoleBuf::Manager consoleOut(std::cout);
  consoleOut.SetUTF8Pipes();
  cmsys::ConsoleBuf::Manager consoleErr(std::cerr, true);
  consoleErr.SetUTF8Pipes();
#endif
  cmsys::Encoding::CommandLineArguments args =
    cmsys::Encoding::CommandLineArguments::Main(ac, av);
  ac = args.argc();
  av = args.argv();

  cmSystemTools::EnableMSVCDebugHook();
  cmSystemTools::InitializeLibUV();
  cmSystemTools::FindCMakeResources(av[0]);
  if (ac > 1) {
    if (strcmp(av[1], "--build") == 0) {
      return do_build(ac, av);
    }
    if (strcmp(av[1], "--install") == 0) {
      return do_install(ac, av);
    }
    if (strcmp(av[1], "--open") == 0) {
      return do_open(ac, av);
    }
    if (strcmp(av[1], "-E") == 0) {
      return do_command(ac, av);
    }
  }
  int ret = do_cmake(ac, av);
#ifdef CMAKE_BUILD_WITH_CMAKE
  cmDynamicLoader::FlushCache();
#endif
  uv_loop_close(uv_default_loop());
  return ret;
}